

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O1

hmm_context_t * hmm_context_init(int32 n_emit_state,uint8 ***tp,int16 *senscore,uint16 **sseq)

{
  hmm_context_t *phVar1;
  int32 *piVar2;
  
  if (0 < n_emit_state) {
    if (n_emit_state < 6) {
      phVar1 = (hmm_context_t *)
               __ckd_calloc__(1,0x38,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/hmm.c"
                              ,0x42);
      phVar1->n_emit_state = n_emit_state;
      phVar1->tp = tp;
      phVar1->senscore = senscore;
      phVar1->sseq = sseq;
      piVar2 = (int32 *)__ckd_calloc__((ulong)(uint)n_emit_state,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/hmm.c"
                                       ,0x47);
      phVar1->st_sen_scr = piVar2;
    }
    else {
      phVar1 = (hmm_context_t *)0x0;
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/hmm.c"
              ,0x3e,"Number of emitting states must be <= %d\n",5);
    }
    return phVar1;
  }
  __assert_fail("n_emit_state > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/hmm.c"
                ,0x3c,
                "hmm_context_t *hmm_context_init(int32, uint8 **const *, const int16 *, uint16 *const *)"
               );
}

Assistant:

hmm_context_t *
hmm_context_init(int32 n_emit_state,
		 uint8 ** const *tp,
		 int16 const *senscore,
		 uint16 * const *sseq)
{
    hmm_context_t *ctx;

    assert(n_emit_state > 0);
    if (n_emit_state > HMM_MAX_NSTATE) {
        E_ERROR("Number of emitting states must be <= %d\n", HMM_MAX_NSTATE);
        return NULL;
    }

    ctx = ckd_calloc(1, sizeof(*ctx));
    ctx->n_emit_state = n_emit_state;
    ctx->tp = tp;
    ctx->senscore = senscore;
    ctx->sseq = sseq;
    ctx->st_sen_scr = ckd_calloc(n_emit_state, sizeof(*ctx->st_sen_scr));

    return ctx;
}